

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

void duckdb::EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  Expression *pEVar6;
  _Alloc_hider _Var7;
  reference this;
  reference this_00;
  reference this_01;
  reference this_02;
  idx_t iVar8;
  reference pvVar9;
  pointer pPVar10;
  InvalidInputException *pIVar11;
  idx_t iVar12;
  pointer pPVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t count;
  idx_t idx;
  bool bVar16;
  STRUCT_STATE a_state;
  STRUCT_STATE d_state;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  Vector intermediate_result;
  string local_238;
  ExpressionState *local_218;
  pointer local_210;
  vector<duckdb::PrimitiveType<double>,_true> local_208;
  Vector *local_1f0;
  GenericListType<duckdb::PrimitiveType<double>_> local_1e8;
  LogicalType local_1d0;
  UnifiedVectorFormat local_1b8;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  local_218 = state;
  local_1f0 = result;
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  this_02 = vector<duckdb::Vector,_true>::operator[](&args->data,3);
  LogicalType::LogicalType((LogicalType *)&local_1b8,DOUBLE);
  LogicalType::LIST(&local_1d0,(LogicalType *)&local_1b8);
  Vector::Vector(&local_98,&local_1d0,0x800);
  LogicalType::~LogicalType(&local_1d0);
  LogicalType::~LogicalType((LogicalType *)&local_1b8);
  bVar16 = false;
  if (((this->vector_type == CONSTANT_VECTOR) && (this_00->vector_type == CONSTANT_VECTOR)) &&
     (this_01->vector_type == CONSTANT_VECTOR)) {
    bVar16 = this_02->vector_type == CONSTANT_VECTOR;
  }
  count = args->count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_1b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
  Vector::ToUnifiedFormat(this,count,&local_1b8);
  Vector::ToUnifiedFormat(this_00,count,&local_e0);
  Vector::ToUnifiedFormat(this_01,count,&local_128);
  Vector::ToUnifiedFormat(this_02,count,&local_170);
  if (bVar16) {
    count = 1;
  }
  if (count != 0) {
    idx = 0;
    do {
      psVar2 = (local_1b8.sel)->sel_vector;
      iVar14 = idx;
      if (psVar2 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar2[idx];
      }
      psVar3 = (local_e0.sel)->sel_vector;
      iVar8 = idx;
      if (psVar3 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar3[idx];
      }
      psVar4 = (local_128.sel)->sel_vector;
      iVar12 = idx;
      if (psVar4 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar4[idx];
      }
      psVar5 = (local_170.sel)->sel_vector;
      iVar15 = idx;
      if (psVar5 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar5[idx];
      }
      if (((((local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)) &&
           ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0 ||
            ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6]
              >> (iVar8 & 0x3f) & 1) != 0)))) &&
          ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 ||
           ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)))) &&
         ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar15 >> 6]
            >> (iVar15 & 0x3f) & 1) != 0)))) {
        iVar14 = idx;
        if (psVar2 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar2[idx];
        }
        iVar8 = idx;
        if (psVar3 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar3[idx];
        }
        iVar12 = idx;
        if (psVar4 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar4[idx];
        }
        iVar15 = idx;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[idx];
        }
        dVar1 = *(double *)(local_1b8.data + iVar14 * 8);
        local_210 = *(pointer *)(local_e0.data + iVar8 * 8);
        if ((double)local_210 < dVar1) {
          pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = local_218->expr;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max value is smaller than min value","");
          InvalidInputException::InvalidInputException<>(pIVar11,pEVar6,&local_238);
          __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        iVar14 = *(idx_t *)(local_128.data + iVar12 * 8);
        if ((long)iVar14 < 1) {
          pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = local_218->expr;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Invalid input for bin function - there must be > 0 bins",
                     "");
          InvalidInputException::InvalidInputException<>(pIVar11,pEVar6,&local_238);
          __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        if (1000000 < (long)iVar14) {
          pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = local_218->expr;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max bin count of %d exceeded","");
          InvalidInputException::InvalidInputException<long>(pIVar11,pEVar6,&local_238,1000000);
          __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        local_238._M_dataplus._M_p = (pointer)0x0;
        local_238._M_string_length = 0;
        local_238.field_2._M_allocated_capacity = 0;
        if (((double)local_210 != dVar1) || (NAN((double)local_210) || NAN(dVar1))) {
          EquiWidthBinsDouble::Operation
                    (&local_208,local_218->expr,dVar1,(double)local_210,iVar14,
                     (bool)local_170.data[iVar15]);
          _Var7._M_p = local_238._M_dataplus._M_p;
          local_238._M_dataplus._M_p =
               (pointer)local_208.
                        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        .
                        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_238._M_string_length =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_238.field_2._M_allocated_capacity =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)_Var7._M_p != (pointer)0x0) {
            operator_delete(_Var7._M_p);
          }
          if (local_208.
              super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
              .
              super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_208.
                            super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                            .
                            super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pvVar9 = vector<duckdb::PrimitiveType<double>,_true>::operator[]
                             ((vector<duckdb::PrimitiveType<double>,_true> *)&local_238,0);
          if (pvVar9->val <= (double)local_210 && (double)local_210 != pvVar9->val) {
            pvVar9 = vector<duckdb::PrimitiveType<double>,_true>::operator[]
                               ((vector<duckdb::PrimitiveType<double>,_true> *)&local_238,0);
            pvVar9->val = (double)local_210;
          }
          pPVar13 = (pointer)(local_238._M_string_length + -8);
          _Var7._M_p = local_238._M_dataplus._M_p;
          if (local_238._M_dataplus._M_p < pPVar13 &&
              local_238._M_dataplus._M_p != (pointer)local_238._M_string_length) {
            do {
              pPVar10 = (pointer)((long)_Var7._M_p + 8);
              dVar1 = ((pointer)_Var7._M_p)->val;
              ((pointer)_Var7._M_p)->val = pPVar13->val;
              pPVar13->val = dVar1;
              pPVar13 = pPVar13 + -1;
              _Var7._M_p = (pointer)pPVar10;
            } while (pPVar10 < pPVar13);
          }
        }
        else {
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_210;
          ::std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
          ::_M_realloc_insert<duckdb::PrimitiveType<double>>
                    ((vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
                      *)&local_238,(iterator)0x0,(PrimitiveType<double> *)&local_208);
        }
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._M_dataplus._M_p;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._M_string_length;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_238.field_2._M_allocated_capacity;
        GenericListType<duckdb::PrimitiveType<double>_>::AssignResult(&local_98,idx,&local_1e8);
        if (local_1e8.values.
            super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            .
            super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.values.
                          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          .
                          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        FlatVector::SetNull(&local_98,idx,true);
      }
      idx = idx + 1;
    } while (idx != count);
  }
  if (bVar16) {
    Vector::SetVectorType(&local_98,CONSTANT_VECTOR);
  }
  if (local_170.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VectorOperations::DefaultCast(&local_98,local_1f0,args->count,false);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return;
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}